

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O3

void dropt_init_help_params(dropt_help_params *helpParams)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  if (helpParams != (dropt_help_params *)0x0) {
    helpParams->indent = 2;
    helpParams->description_start_column = 6;
    helpParams->blank_lines_between_options = '\x01';
    return;
  }
  dropt_init_help_params_cold_1();
  if (helpParams != (dropt_help_params *)0x0) {
    if ((((*(long *)&helpParams->blank_lines_between_options == 0) &&
         ((char)helpParams->indent == '\0')) &&
        (lVar1._0_4_ = helpParams[1].description_start_column,
        lVar1._4_1_ = helpParams[1].blank_lines_between_options,
        lVar1._5_3_ = *(undefined3 *)&helpParams[1].field_0x9, lVar1 == 0)) &&
       (((lVar2._0_4_ = helpParams[2].indent, lVar2._4_4_ = helpParams[2].description_start_column,
         lVar2 == 0 && (*(long *)&helpParams[2].blank_lines_between_options == 0)) &&
        ((lVar3._0_4_ = helpParams[3].description_start_column,
         lVar3._4_1_ = helpParams[3].blank_lines_between_options,
         lVar3._5_3_ = *(undefined3 *)&helpParams[3].field_0x9, lVar3 == 0 &&
         (helpParams[4].indent == 0)))))) {
      return;
    }
    return;
  }
  return;
}

Assistant:

void
dropt_init_help_params(dropt_help_params* helpParams)
{
    if (helpParams == NULL)
    {
        DROPT_MISUSE("No dropt help parameters specified.");
        return;
    }

    helpParams->indent = default_help_indent;
    helpParams->description_start_column = default_description_start_column;
    helpParams->blank_lines_between_options = true;
}